

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall pugi::xml_text::set(xml_text *this,int rhs)

{
  xml_node_struct *header;
  bool local_21;
  xml_node_struct *dn;
  int rhs_local;
  xml_text *this_local;
  
  header = _data_new(this);
  if (header == (xml_node_struct *)0x0) {
    local_21 = false;
  }
  else {
    local_21 = impl::anon_unknown_0::set_value_convert(&header->value,&header->header,8,rhs);
  }
  return local_21;
}

Assistant:

PUGI__FN bool xml_text::set(int rhs)
	{
		xml_node_struct* dn = _data_new();

		return dn ? impl::set_value_convert(dn->value, dn->header, impl::xml_memory_page_value_allocated_mask, rhs) : false;
	}